

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O3

char * cppcms::http::protocol::tocken<char_const*>(char *begin,char *end)

{
  byte bVar1;
  
  if (begin < end) {
    while ((bVar1 = *begin, (byte)(bVar1 - 0x20) < 0x5f &&
           (((0x3d < bVar1 - 0x20 ||
             ((0x38000001fc009305U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) && (bVar1 != 0x7b))
           ))) {
      if (bVar1 == 0x7d) {
        return (char *)(byte *)begin;
      }
      begin = (char *)((byte *)begin + 1);
      if (begin == end) {
        return end;
      }
    }
  }
  return begin;
}

Assistant:

It tocken(It begin,It end)
	{
		char c;
		while(begin < end && 0x20<=(c=*begin) && c<=0x7E && !separator(c))
			begin++;
		return begin;
	}